

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O2

KeyData * __thiscall
cfd::core::Descriptor::GetKeyData(KeyData *__return_storage_ptr__,Descriptor *this,string *argument)

{
  uint32_t uVar1;
  uint32_t index;
  uint uVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar2 = 0;
  while( true ) {
    uVar1 = DescriptorNode::GetNeedArgumentNum(&this->root_node_);
    if (uVar1 <= uVar2) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_48,(value_type *)argument);
    uVar2 = uVar2 + 1;
  }
  GetKeyData(__return_storage_ptr__,this,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return __return_storage_ptr__;
}

Assistant:

KeyData Descriptor::GetKeyData(const std::string& argument) const {
  std::vector<std::string> list;
  for (uint32_t index = 0; index < GetNeedArgumentNum(); ++index) {
    list.push_back(argument);
  }
  return GetKeyData(list);
}